

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O0

void PrintInfoOnTarget(Component *c)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t sVar6;
  size_type sVar7;
  size_type sVar8;
  _Node_iterator_base<File_*,_false> c_00;
  reference ppFVar9;
  path *in_RDI;
  File **d_3;
  iterator __end1_3;
  iterator __begin1_3;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
  *__range1_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d_2;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sortedPrivDeps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sortedPubDeps;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
  *in_stack_fffffffffffffe98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffea0;
  Component *in_stack_fffffffffffffec0;
  _Node_iterator_base<File_*,_false> local_b8;
  size_type *local_b0;
  reference local_a8;
  _Self local_a0;
  _Self local_98;
  undefined1 *local_90;
  reference local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  path *local_8;
  
  if (in_RDI == (path *)0x0) {
    std::operator<<((ostream *)&std::cout,"Component does not exist (double-check spelling)\n");
  }
  else {
    local_8 = in_RDI;
    poVar2 = std::operator<<((ostream *)&std::cout,"Root: ");
    psVar3 = boost::filesystem::path::string_abi_cxx11_(local_8);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<((ostream *)&std::cout,"Name: ");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    poVar5 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)&std::cout,"Type: ");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)&std::cout,"Lines of Code: ");
    sVar6 = Component::loc(in_stack_fffffffffffffec0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)&std::cout,"Recreate: ");
    pcVar4 = "false";
    if (((byte)local_8[0xe].m_pathname._M_dataplus & 1) != 0) {
      pcVar4 = "true";
    }
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5,'\n');
    poVar5 = std::operator<<((ostream *)&std::cout,"Has CMakeAddon.txt: ");
    pcVar4 = "false";
    if ((local_8[0xe].m_pathname.field_0x1 & 1) != 0) {
      pcVar4 = "true";
    }
    poVar5 = std::operator<<(poVar5,pcVar4);
    std::operator<<(poVar5,'\n');
    SortedNiceNames_abi_cxx11_
              ((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                *)poVar2);
    poVar5 = std::operator<<((ostream *)&std::cout,"Public dependencies (");
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_20);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
    std::operator<<(poVar5,"): ");
    local_38 = &local_20;
    local_40._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe98);
    local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffea0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      local_50 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_40);
      poVar5 = std::operator<<((ostream *)&std::cout,' ');
      std::operator<<(poVar5,(string *)local_50);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_40);
    }
    SortedNiceNames_abi_cxx11_
              ((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                *)poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"\nPrivate dependencies (");
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_68);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar7);
    std::operator<<(poVar2,"): ");
    local_70 = &local_68;
    local_78._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe98);
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe98);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffea0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      local_88 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_78);
      poVar2 = std::operator<<((ostream *)&std::cout,' ');
      std::operator<<(poVar2,(string *)local_88);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_78);
    }
    std::operator<<((ostream *)&std::cout,"\nBuild-afters:");
    local_90 = (undefined1 *)((long)&local_8[10].m_pathname.field_2 + 8);
    local_98._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe98);
    local_a0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe98);
    while( true ) {
      bVar1 = std::operator!=(&local_98,&local_a0);
      if (!bVar1) break;
      local_a8 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffea0);
      poVar2 = std::operator<<((ostream *)&std::cout,' ');
      std::operator<<(poVar2,(string *)local_a8);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffea0);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"\nFiles (");
    sVar8 = std::
            unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
            ::size((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                    *)0x1a4e4d);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar8);
    std::operator<<(poVar2,"):");
    local_b0 = &local_8[0xc].m_pathname._M_string_length;
    local_b8._M_cur =
         (__node_type *)
         std::
         unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>::
         begin(in_stack_fffffffffffffe98);
    c_00._M_cur = (__node_type *)
                  std::
                  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                  ::end(in_stack_fffffffffffffe98);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&local_b8,(_Node_iterator_base<File_*,_false> *)&stack0xffffffffffffff40);
      if (!bVar1) break;
      ppFVar9 = std::__detail::_Node_iterator<File_*,_true,_false>::operator*
                          ((_Node_iterator<File_*,_true,_false> *)0x1a4edc);
      poVar5 = std::operator<<((ostream *)&std::cout,' ');
      psVar3 = boost::filesystem::path::string_abi_cxx11_(&(*ppFVar9)->path);
      std::operator<<(poVar5,(string *)psVar3);
      std::__detail::_Node_iterator<File_*,_true,_false>::operator++
                ((_Node_iterator<File_*,_true,_false> *)psVar3);
    }
    std::operator<<((ostream *)&std::cout,'\n');
    PrintLinksForTarget((Component *)c_00._M_cur);
    std::operator<<((ostream *)&std::cout,'\n');
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)poVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)poVar2);
  }
  return;
}

Assistant:

void PrintInfoOnTarget(Component *c) {
    if (!c) {
        std::cout << "Component does not exist (double-check spelling)\n";
        return;
    }
    std::cout << "Root: " << c->root.string() << '\n';
    std::cout << "Name: " << c->name.c_str() << '\n';
    std::cout << "Type: " << c->type.c_str() << '\n';
    std::cout << "Lines of Code: " << c->loc() << '\n';
    std::cout << "Recreate: " << (c->recreate ? "true" : "false") << '\n';
    std::cout << "Has CMakeAddon.txt: " << (c->hasAddonCmake ? "true" : "false") << '\n';

    std::vector<std::string> sortedPubDeps(SortedNiceNames(c->pubDeps));
    std::cout << "Public dependencies (" << sortedPubDeps.size() << "): ";
    for (auto &d : sortedPubDeps) {
        std::cout << ' ' << d;
    }
    std::vector<std::string> sortedPrivDeps(SortedNiceNames(c->privDeps));
    std::cout << "\nPrivate dependencies (" << sortedPrivDeps.size() << "): ";
    for (auto &d : sortedPrivDeps) {
        std::cout << ' ' << d;
    }
    std::cout << "\nBuild-afters:";
    for (auto &d : c->buildAfters) {
        std::cout << ' ' << d;
    }
    std::cout << "\nFiles (" << c->files.size() << "):";
    for (auto &d : c->files) {
        std::cout << ' ' << d->path.string();
    }
    std::cout << '\n';
    PrintLinksForTarget(c);
    std::cout << '\n';
}